

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

DeepFrameBuffer * __thiscall
Imf_3_4::DeepScanLineInputFile::frameBuffer(DeepScanLineInputFile *this)

{
  element_type *peVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::
  __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a546c);
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  peVar1 = std::
           __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a548e);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a54a1);
  return &peVar1->frameBuffer;
}

Assistant:

const DeepFrameBuffer&
DeepScanLineInputFile::frameBuffer () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    return _data->frameBuffer;
}